

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCallRef
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,CallRef *curr)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  Literal *other;
  Name name;
  undefined1 local_178 [8];
  Flow flow;
  SmallVector<wasm::Literal,_1UL> local_f8;
  undefined1 local_c0 [8];
  Flow target;
  Literals arguments;
  Literal targetRef;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  target.breakTo.super_IString.str._M_str = (char *)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_178,&this->super_ExpressionRunner<wasm::ModuleRunner>,&curr->operands,
             (Literals *)&target.breakTo.super_IString.str._M_str);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)local_c0,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->target);
    if (target.breakTo.super_IString.str._M_len == 0) {
      other = Flow::getSingleValue((Flow *)local_c0);
      Literal::Literal((Literal *)
                       &arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,other);
      bVar3 = wasm::Type::isNull((Type *)&targetRef.field_0.func.super_IString.str._M_str);
      if (bVar3) {
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                  (this,"null target in call_ref");
      }
      if (curr->isReturn == true) {
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)&target.breakTo.super_IString.str._M_str,
                   (Literal *)
                   &arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        pcVar2 = DAT_01176148;
        sVar1 = RETURN_CALL_FLOW;
        SmallVector<wasm::Literal,_1UL>::SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
                   (SmallVector<wasm::Literal,_1UL> *)&target.breakTo.super_IString.str._M_str);
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar1;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar2;
      }
      else {
        name = Literal::getFunc((Literal *)
                                &arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
        SmallVector<wasm::Literal,_1UL>::SmallVector
                  (&local_f8,
                   (SmallVector<wasm::Literal,_1UL> *)&target.breakTo.super_IString.str._M_str);
        callFunction((Literals *)&flow.breakTo.super_IString.str._M_str,this,name,
                     (Literals *)&local_f8);
        Flow::Flow(__return_storage_ptr__,(Literals *)&flow.breakTo.super_IString.str._M_str);
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
        SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_f8);
      }
      Literal::~Literal((Literal *)
                        &arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_c0);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_c0);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_178);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_178);
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&target.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCallRef(CallRef* curr) {
    NOTE_ENTER("CallRef");
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    Flow target = self()->visit(curr->target);
    if (target.breaking()) {
      return target;
    }
    auto targetRef = target.getSingleValue();
    if (targetRef.isNull()) {
      trap("null target in call_ref");
    }

    if (curr->isReturn) {
      // Return calls are represented by their arguments followed by a reference
      // to the function to be called.
      arguments.push_back(targetRef);
      return Flow(RETURN_CALL_FLOW, std::move(arguments));
    }

    Flow ret = callFunction(targetRef.getFunc(), arguments);
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "(returned to " << scope->function->name << ")\n";
#endif
    return ret;
  }